

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall blip_eq_t::generate(blip_eq_t *this,float *out,int count)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar5 = (double)this->sample_rate * 0.5;
  if (this->cutoff_freq == 0) {
    dVar13 = 144.0 / (double)count + 0.85;
  }
  else {
    dVar13 = dVar5 / (double)this->cutoff_freq;
  }
  dVar5 = ((double)this->rolloff_freq * dVar13) / dVar5;
  dVar6 = this->treble;
  if (0.999 <= dVar5) {
    dVar5 = 0.999;
  }
  if (dVar6 <= -300.0) {
    dVar6 = -300.0;
  }
  if (5.0 <= dVar6) {
    dVar6 = 5.0;
  }
  dVar6 = exp2((dVar6 * 4.0550880064543e-05) / (1.0 - dVar5));
  dVar7 = pow(dVar6,4096.0 - dVar5 * 4096.0);
  uVar3 = 0;
  iVar1 = 0;
  if (0 < count) {
    iVar1 = count;
  }
  for (; (uint)(iVar1 * 2) != uVar3; uVar3 = uVar3 + 2) {
    dVar12 = (double)((int)uVar3 + count * -2 + 1) * 5.992112452678286e-06 * (1.0 / dVar13);
    dVar8 = 4096.0;
    dVar14 = dVar12 * 4096.0 * dVar5;
    if (dVar14 != 0.0) {
      dVar8 = sin(dVar14);
      dVar8 = (dVar8 * 4096.0) / dVar14;
    }
    dVar9 = cos(dVar12);
    dVar9 = (dVar6 - (dVar9 + dVar9)) * dVar6 + 1.0;
    if (1e-13 < dVar9) {
      dVar10 = cos(dVar12 * 4095.0);
      dVar11 = cos(dVar12 * 4096.0);
      dVar12 = cos(dVar14 - dVar12);
      dVar14 = cos(dVar14);
      dVar8 = dVar8 * dVar5 +
              ((dVar14 + (dVar10 * dVar6 - dVar11) * dVar7) - dVar12 * dVar6) / dVar9;
    }
    *(float *)((long)out + uVar3 * 2) = (float)dVar8;
  }
  iVar1 = count + -1;
  dVar5 = (double)iVar1;
  lVar2 = (long)count;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    dVar13 = cos((double)iVar1 * 3.141592653589793 * (1.0 / dVar5));
    out[lVar2] = ((float)dVar13 * -0.46 + 0.54) * out[lVar2];
    iVar1 = iVar1 + -1;
  }
  return;
}

Assistant:

void blip_eq_t::generate( float* out, int count ) const
{
	// lower cutoff freq for narrow kernels with their wider transition band
	// (8 points->1.49, 16 points->1.15)
	double oversample = blip_res * 2.25 / count + 0.85;
	double half_rate = sample_rate * 0.5;
	if ( cutoff_freq )
		oversample = half_rate / cutoff_freq;
	double cutoff = rolloff_freq * oversample / half_rate;
	
	gen_sinc( out, count, blip_res * oversample, treble, cutoff );
	
	// apply (half of) hamming window
	double to_fraction = PI / (count - 1);
	for ( int i = count; i--; )
		out [i] *= 0.54f - 0.46f * (float) cos( i * to_fraction );
}